

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::PrismaticJoint::PrismaticJoint
          (PrismaticJoint *this,LinkIndex _link1,LinkIndex _link2,Transform *_link1_X_link2,
          Axis *_translation_axis_wrt_link1)

{
  Transform *in_RCX;
  LinkIndex in_RDX;
  LinkIndex in_RSI;
  PrismaticJoint *in_RDI;
  Axis *in_R8;
  double in_stack_000000d8;
  PrismaticJoint *in_stack_000000e0;
  
  MovableJointImpl<1U,_1U>::MovableJointImpl(&in_RDI->super_MovableJointImpl1);
  (in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint =
       (_func_int **)&PTR__PrismaticJoint_004fa420;
  in_RDI->link1 = in_RSI;
  in_RDI->link2 = in_RDX;
  iDynTree::Transform::Transform(&in_RDI->link1_X_link2_at_rest,in_RCX);
  iDynTree::Axis::Axis(&in_RDI->translation_axis_wrt_link1,in_R8);
  iDynTree::Transform::Transform(&in_RDI->link1_X_link2);
  iDynTree::Transform::Transform(&in_RDI->link2_X_link1);
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x466ff0);
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x467003);
  (*(in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x15])(in_RDI,0);
  (*(in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x17])(in_RDI,0);
  resetAxisBuffers(in_stack_000000e0);
  resetBuffers(in_stack_000000e0,in_stack_000000d8);
  disablePosLimits(in_RDI);
  resetJointDynamics(in_RDI);
  return;
}

Assistant:

PrismaticJoint::PrismaticJoint(const LinkIndex _link1, const LinkIndex _link2,
                             const Transform& _link1_X_link2, const Axis& _translation_axis_wrt_link1):
                             link1(_link1), link2(_link2), link1_X_link2_at_rest(_link1_X_link2),
                             translation_axis_wrt_link1(_translation_axis_wrt_link1)
{
    this->setPosCoordsOffset(0);
    this->setDOFsOffset(0);

    this->resetAxisBuffers();
    this->resetBuffers(0);
    this->disablePosLimits();
    this->resetJointDynamics();
}